

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O0

void __thiscall t_py_generator::init_generator(t_py_generator *this)

{
  t_program *program;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  ulong uVar5;
  long lVar6;
  vector<t_service_*,_std::allocator<t_service_*>_> *__x;
  reference pptVar7;
  undefined4 extraout_var;
  ostream *poVar8;
  int __oflag;
  int __oflag_00;
  int __oflag_01;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_> local_610
  ;
  t_service **local_608;
  __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_> local_600
  ;
  iterator sv_iter;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  string local_5d8 [32];
  undefined1 local_5b8 [8];
  ofstream_with_content_based_conditional_update f_init;
  string f_init_name;
  string local_3f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  undefined1 local_3b0 [8];
  string f_consts_name;
  string local_388 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  undefined1 local_348 [8];
  string f_types_name;
  size_type pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  undefined1 local_2d8 [8];
  ofstream init_py;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  int local_8c;
  string local_88 [4];
  int r;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  string module;
  t_py_generator *this_local;
  
  program = (this->super_t_generator).program_;
  bVar1 = this->gen_twisted_;
  module.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"",&local_51);
  get_real_py_module((string *)local_30,program,(bool)(bVar1 & 1),&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(local_88);
  std::__cxx11::string::operator=((string *)&this->package_dir_,local_88);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::operator=((string *)&this->module_,(string *)local_30);
  do {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    local_8c = mkdir(pcVar3,0x1ff);
    if ((local_8c == -1) && (piVar4 = __errno_location(), *piVar4 != 0x11)) {
      init_py._510_1_ = 1;
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d0,pcVar3,(allocator *)&init_py.field_0x1ff);
      std::operator+(&local_b0,&local_d0,": ");
      piVar4 = __errno_location();
      pcVar3 = strerror(*piVar4);
      std::operator+(__return_storage_ptr__,&local_b0,pcVar3);
      init_py._510_1_ = 0;
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
    std::operator+(&local_2f8,&this->package_dir_,"/__init__.py");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_2d8,pcVar3,_S_app);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::ofstream::close();
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      lVar6 = std::__cxx11::string::find((char)local_30,0x2e);
      if (lVar6 == -1) {
        std::__cxx11::string::operator+=((string *)&this->package_dir_,"/");
        std::__cxx11::string::operator+=((string *)&this->package_dir_,(string *)local_30);
        std::__cxx11::string::clear();
      }
      else {
        std::__cxx11::string::operator+=((string *)&this->package_dir_,"/");
        std::__cxx11::string::substr((ulong)((long)&f_types_name.field_2 + 8),(ulong)local_30);
        std::__cxx11::string::operator+=
                  ((string *)&this->package_dir_,(string *)(f_types_name.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(f_types_name.field_2._M_local_buf + 8));
        std::__cxx11::string::erase((ulong)local_30,0);
      }
      pos._4_4_ = 0;
    }
    else {
      pos._4_4_ = 3;
    }
    std::ofstream::~ofstream(local_2d8);
  } while (pos._4_4_ == 0);
  std::operator+(&local_368,&this->package_dir_,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 &local_368,"ttypes.py");
  std::__cxx11::string::~string((string *)&local_368);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_388,pcVar3,(allocator *)(f_consts_name.field_2._M_local_buf + 0xf));
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_types_,(char *)local_388,__oflag);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)(f_consts_name.field_2._M_local_buf + 0xf));
  std::operator+(&local_3d0,&this->package_dir_,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0,
                 &local_3d0,"constants.py");
  std::__cxx11::string::~string((string *)&local_3d0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3f0,pcVar3,(allocator *)(f_init_name.field_2._M_local_buf + 0xf));
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_consts_,(char *)local_3f0,__oflag_00);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)(f_init_name.field_2._M_local_buf + 0xf));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &f_init.field_0x198,&this->package_dir_,"/__init__.py");
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_5b8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_5d8,pcVar3,
             (allocator *)
             ((long)&services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_5b8,(char *)local_5d8,__oflag_01);
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::operator<<((ostream *)local_5b8,"__all__ = [\'ttypes\', \'constants\'");
  __x = t_program::get_services((this->super_t_generator).program_);
  std::vector<t_service_*,_std::allocator<t_service_*>_>::vector
            ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>::
  __normal_iterator(&local_600);
  local_608 = (t_service **)
              std::vector<t_service_*,_std::allocator<t_service_*>_>::begin
                        ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter);
  local_600._M_current = local_608;
  while( true ) {
    local_610._M_current =
         (t_service **)
         std::vector<t_service_*,_std::allocator<t_service_*>_>::end
                   ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter);
    bVar1 = __gnu_cxx::operator!=(&local_600,&local_610);
    if (!bVar1) break;
    poVar8 = std::operator<<((ostream *)local_5b8,", \'");
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
              ::operator*(&local_600);
    iVar2 = (*((*pptVar7)->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar8 = std::operator<<(poVar8,(string *)CONCAT44(extraout_var,iVar2));
    std::operator<<(poVar8,"\'");
    __gnu_cxx::
    __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>::
    operator++(&local_600);
  }
  poVar8 = std::operator<<((ostream *)local_5b8,"]");
  iVar2 = 0x56c2a8;
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_5b8,iVar2);
  py_autogen_comment_abi_cxx11_(&local_630,this);
  poVar8 = std::operator<<((ostream *)&this->f_types_,(string *)&local_630);
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  py_imports_abi_cxx11_(&local_650,this);
  poVar8 = std::operator<<(poVar8,(string *)&local_650);
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  render_includes_abi_cxx11_(&local_670,this);
  poVar8 = std::operator<<(poVar8,(string *)&local_670);
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<(poVar8,"from thrift.transport import TTransport");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar8,(string *)&this->import_dynbase_);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_630);
  poVar8 = std::operator<<((ostream *)&this->f_types_,"all_structs = []");
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  py_autogen_comment_abi_cxx11_(&local_690,this);
  poVar8 = std::operator<<((ostream *)&this->f_consts_,(string *)&local_690);
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  py_imports_abi_cxx11_(&local_6b0,this);
  poVar8 = std::operator<<(poVar8,(string *)&local_6b0);
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<(poVar8,"from .ttypes import *");
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::~string((string *)&local_690);
  std::vector<t_service_*,_std::allocator<t_service_*>_>::~vector
            ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_5b8);
  std::__cxx11::string::~string((string *)&f_init.field_0x198);
  std::__cxx11::string::~string((string *)local_3b0);
  std::__cxx11::string::~string((string *)local_348);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void t_py_generator::init_generator() {
  // Make output directory
  string module = get_real_py_module(program_, gen_twisted_);
  package_dir_ = get_out_dir();
  module_ = module;
  while (true) {
    // TODO: Do better error checking here.
    MKDIR(package_dir_.c_str());
    std::ofstream init_py((package_dir_ + "/__init__.py").c_str(), std::ios_base::app);
    init_py.close();
    if (module.empty()) {
      break;
    }
    string::size_type pos = module.find('.');
    if (pos == string::npos) {
      package_dir_ += "/";
      package_dir_ += module;
      module.clear();
    } else {
      package_dir_ += "/";
      package_dir_ += module.substr(0, pos);
      module.erase(0, pos + 1);
    }
  }

  // Make output file
  string f_types_name = package_dir_ + "/" + "ttypes.py";
  f_types_.open(f_types_name.c_str());

  string f_consts_name = package_dir_ + "/" + "constants.py";
  f_consts_.open(f_consts_name.c_str());

  string f_init_name = package_dir_ + "/__init__.py";
  ofstream_with_content_based_conditional_update f_init;
  f_init.open(f_init_name.c_str());
  f_init << "__all__ = ['ttypes', 'constants'";
  vector<t_service*> services = program_->get_services();
  vector<t_service*>::iterator sv_iter;
  for (sv_iter = services.begin(); sv_iter != services.end(); ++sv_iter) {
    f_init << ", '" << (*sv_iter)->get_name() << "'";
  }
  f_init << "]" << endl;
  f_init.close();

  // Print header
  f_types_ << py_autogen_comment() << endl
           << py_imports() << endl
           << render_includes() << endl
           << "from thrift.transport import TTransport" << endl
           << import_dynbase_;

  f_types_ << "all_structs = []" << endl;

  f_consts_ <<
    py_autogen_comment() << endl <<
    py_imports() << endl <<
    "from .ttypes import *" << endl;
}